

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

int Mf_CutDeref_rec(Mf_Man_t *p,int *pCut)

{
  Jf_Par_t *pJVar1;
  int iVar2;
  uint uVar3;
  short sVar4;
  int iVar5;
  ulong uVar6;
  
  uVar3 = *pCut & 0x1f;
  iVar5 = 0;
  if (1 < uVar3) {
    pJVar1 = p->pPars;
    if (pJVar1->fGenCnf == 0) {
      if (pJVar1->fOptEdge == 0) {
        iVar5 = 1;
      }
      else {
        iVar5 = uVar3 + pJVar1->nAreaTuner;
      }
    }
    else {
      uVar3 = (uint)*pCut >> 6;
      if ((p->vCnfSizes).nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = (p->vCnfSizes).pArray[uVar3];
    }
  }
  if ((*pCut & 0x1f) != 0) {
    uVar6 = 0;
    do {
      sVar4 = *(short *)&p->pLfObjs[pCut[uVar6 + 1]].field_0xe + -1;
      *(short *)&p->pLfObjs[pCut[uVar6 + 1]].field_0xe = sVar4;
      if ((sVar4 == 0) && (iVar2 = p->pLfObjs[pCut[uVar6 + 1]].iCutSet, iVar2 != 0)) {
        uVar3 = iVar2 >> 0x10;
        if (((int)uVar3 < 0) || ((p->vPages).nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar2 = Mf_CutDeref_rec(p,(int *)((long)(p->vPages).pArray[uVar3] +
                                         (ulong)(ushort)iVar2 * 4 + 4));
        iVar5 = iVar5 + iVar2;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (*pCut & 0x1f));
  }
  return iVar5;
}

Assistant:

int Mf_CutDeref_rec( Mf_Man_t * p, int * pCut )
{
    int i, Count = Mf_CutArea(p, Mf_CutSize(pCut), Mf_CutFunc(pCut));
    for ( i = 1; i <= Mf_CutSize(pCut); i++ )
        if ( !Mf_ObjMapRefDec(p, pCut[i]) && Mf_ManObj(p, pCut[i])->iCutSet )
            Count += Mf_CutDeref_rec( p, Mf_ObjCutBest(p, pCut[i]) );
    return Count;
}